

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swipe.cc
# Opt level: O1

vector sptk::swipe::swipe(vector<double,_std::allocator<double>_> *waveform,double samplerate,
                         double min,double max,double st,double dt)

{
  int iVar1;
  pointer pdVar2;
  bool bVar3;
  double dVar4;
  vector fERBs;
  vector fERBs_00;
  vector d;
  vector d_00;
  vector d_01;
  intvector ws;
  intvector ws_00;
  intvector ps;
  intvector ps_00;
  intvector ps_01;
  uint uVar5;
  uint xSz;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int n;
  double *pdVar12;
  double *pdVar13;
  double *pdVar14;
  int *extraout_RDX_00;
  int *extraout_RDX_01;
  double *extraout_RDX_02;
  double *extraout_RDX_03;
  undefined8 extraout_RDX_04;
  int n_00;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  double nyquist;
  intvector iVar19;
  vector vVar20;
  matrix mVar21;
  vector vVar22;
  intvector ones;
  vector yr_vector;
  intvector yr_vector_00;
  intvector yr_vector_01;
  vector yr_vector_02;
  vector yr_vector_03;
  vector yr_vector_04;
  vector x;
  vector x_00;
  vector x_01;
  vector pc;
  vector pc_00;
  vector pc_01;
  vector pc_02;
  double local_178;
  double local_160;
  double **local_138;
  swipe *local_118;
  undefined4 uStack_ec;
  undefined4 uStack_dc;
  undefined4 uStack_cc;
  undefined4 uStack_bc;
  undefined4 uStack_ac;
  undefined4 uStack_9c;
  undefined4 uStack_8c;
  undefined4 uStack_7c;
  undefined4 uStack_6c;
  undefined4 uStack_5c;
  undefined4 uStack_4c;
  undefined4 uStack_3c;
  int *piVar10;
  double *pdVar11;
  double *extraout_RDX;
  double **extraout_RDX_05;
  
  nyquist = samplerate * 0.5;
  local_160 = max;
  if (nyquist < max) {
    swipe((swipe *)waveform);
    local_160 = nyquist;
  }
  dVar18 = samplerate * 8.0;
  if (samplerate < dt) {
    fprintf(_stderr,"Timestep > SR...timestep set to %f.\n");
    dt = samplerate;
  }
  dVar15 = log(dVar18 / min);
  dVar4 = log(dVar18 / local_160);
  auVar16._8_8_ = dVar4;
  auVar16._0_8_ = dVar15;
  auVar16 = divpd(auVar16,_DAT_0012b220);
  dVar15 = auVar16._0_8_ - auVar16._8_8_;
  dVar15 = floor(dVar15 + *(double *)(&DAT_0012b200 + (ulong)(dVar15 < 0.0) * 8));
  iVar19 = makeiv((int)(dVar15 + 1.0));
  piVar10 = iVar19.v;
  uVar5 = iVar19.x;
  if (0 < (int)uVar5) {
    pc_00._0_8_ = 0;
    do {
      dVar15 = log(dVar18 / min);
      dVar15 = floor(dVar15 / 0.6931471805599453 +
                     *(double *)(&DAT_0012b200 + (ulong)(dVar15 / 0.6931471805599453 < 0.0) * 8));
      dVar15 = exp2(dVar15);
      dVar4 = exp2((double)(int)pc_00._0_8_);
      piVar10[pc_00._0_8_] = (int)(dVar15 / dVar4);
      pc_00._0_8_ = pc_00._0_8_ + 1;
    } while (uVar5 != pc_00._0_8_);
  }
  dVar15 = log(local_160);
  dVar4 = log(min);
  auVar17._8_8_ = dVar4;
  auVar17._0_8_ = dVar15;
  auVar16 = divpd(auVar17,_DAT_0012b220);
  dVar15 = ceil((auVar16._0_8_ - auVar16._8_8_) / 0.0104167);
  vVar20 = makev((int)dVar15);
  pdVar11 = vVar20.v;
  xSz = vVar20.x;
  vVar20 = makev(xSz);
  pdVar12 = vVar20.v;
  uVar6 = vVar20.x;
  local_178 = 0.0;
  if (0 < (int)xSz) {
    pc_00._0_8_ = (ulong)xSz;
    do {
      dVar15 = log(min);
      local_178 = (double)(int)(pc_00._0_8_ - 1) * 0.0104167 + dVar15 / 0.6931471805599453;
      dVar15 = exp2(local_178);
      pdVar11[pc_00._0_8_ - 1] = dVar15;
      dVar15 = log(dVar18 / (double)*piVar10);
      pdVar12[pc_00._0_8_ - 1] = (local_178 + 1.0) - dVar15 / 0.6931471805599453;
      bVar3 = 1 < (long)pc_00._0_8_;
      pc_00._0_8_ = pc_00._0_8_ - 1;
    } while (bVar3);
  }
  uVar8 = (uint)((ulong)((long)(waveform->super__Vector_base<double,_std::allocator<double>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(waveform->super__Vector_base<double,_std::allocator<double>_>).
                              _M_impl.super__Vector_impl_data._M_start) >> 3);
  vVar20 = makev(uVar8);
  pdVar13 = vVar20.v;
  uVar7 = vVar20.x;
  if (0 < (int)uVar8) {
    pdVar2 = (waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pc_00._0_8_ = 0;
    do {
      pdVar13[pc_00._0_8_] = pdVar2[pc_00._0_8_] * 3.0517578125e-05;
      pc_00._0_8_ = pc_00._0_8_ + 1;
    } while ((uVar8 & 0x7fffffff) != pc_00._0_8_);
  }
  dVar18 = log10(nyquist / 229.0 + 1.0);
  dVar15 = exp2(local_178);
  dVar15 = log10((dVar15 * 0.25) / 229.0 + 1.0);
  dVar18 = ceil((dVar18 * 21.4 - dVar15 * 21.4) / 0.1);
  vVar20 = makev((int)dVar18);
  pdVar14 = vVar20.v;
  uVar8 = vVar20.x;
  dVar18 = log10((min * 0.25) / 229.0 + 1.0);
  if (0 < (int)uVar8) {
    pc_00._0_8_ = 0;
    do {
      dVar15 = pow(10.0,((double)(int)pc_00._0_8_ * 0.1 + dVar18 * 21.4) / 21.4);
      pdVar14[pc_00._0_8_] = (dVar15 + -1.0) * 229.0;
      pc_00._0_8_ = pc_00._0_8_ + 1;
    } while (uVar8 != pc_00._0_8_);
  }
  dVar18 = floor(pdVar14[(long)(int)uVar8 + -1] / *pdVar11 + -0.75);
  iVar19 = onesiv((int)dVar18);
  ones.v = iVar19.v;
  uVar9 = iVar19.x;
  ones._0_8_ = ones.v;
  sieve((swipe *)(ulong)uVar9,ones);
  *ones.v = 1;
  dVar18 = ceil(((double)(int)uVar7 / samplerate) / dt);
  mVar21 = zerom(xSz,(int)dVar18);
  pc_00._0_8_ = CONCAT44(0,uVar8);
  ps._4_4_ = uStack_6c;
  ps.x = uVar9;
  iVar19._4_4_ = uStack_5c;
  iVar19.x = uVar5;
  d._4_4_ = uStack_4c;
  d.x = uVar6;
  vVar20._4_4_ = uStack_3c;
  vVar20.x = uVar8;
  x._4_4_ = 0;
  x.x = uVar7;
  vVar20.v = pdVar14;
  d.v = pdVar12;
  iVar19.v = piVar10;
  ps.v = ones.v;
  x.v = pdVar13;
  pc_00.v = pdVar11;
  Sfirst(mVar21,x,pc_00,vVar20,d,iVar19,ps,nyquist,samplerate,dt,0);
  n = 1;
  local_118 = mVar21._0_8_;
  if (2 < (int)uVar5) {
    n_00 = 1;
    do {
      ps_00._4_4_ = uStack_ac;
      ps_00.x = uVar9;
      ws._4_4_ = uStack_9c;
      ws.x = uVar5;
      d_00._4_4_ = uStack_8c;
      d_00.x = uVar6;
      fERBs._4_4_ = uStack_7c;
      fERBs.x = uVar8;
      x_00._4_4_ = 0;
      x_00.x = uVar7;
      fERBs.v = pdVar14;
      d_00.v = pdVar12;
      ws.v = piVar10;
      ps_00.v = ones.v;
      x_00.v = pdVar13;
      pc_01.v = pdVar11;
      pc_01._0_8_ = pc_00._0_8_;
      Snth(mVar21,x_00,pc_01,fERBs,d_00,ws,ps_00,nyquist,samplerate,dt,n_00);
      n = n_00 + 1;
      iVar1 = n_00 - uVar5;
      n_00 = n;
    } while (iVar1 != -2);
  }
  local_138 = mVar21.m;
  ps_01._4_4_ = uStack_ec;
  ps_01.x = uVar9;
  ws_00._4_4_ = uStack_dc;
  ws_00.x = uVar5;
  d_01._4_4_ = uStack_cc;
  d_01.x = uVar6;
  fERBs_00._4_4_ = uStack_bc;
  fERBs_00.x = uVar8;
  x_01._4_4_ = 0;
  x_01.x = uVar7;
  fERBs_00.v = pdVar14;
  d_01.v = pdVar12;
  ws_00.v = piVar10;
  ps_01.v = ones.v;
  x_01.v = pdVar13;
  pc_02.v = pdVar11;
  pc_02._0_8_ = pc_00._0_8_;
  Slast(mVar21,x_01,pc_02,fERBs_00,d_01,ws_00,ps_01,nyquist,samplerate,dt,n);
  yr_vector.v = extraout_RDX;
  yr_vector._0_8_ = pdVar14;
  freev((swipe *)(ulong)uVar8,yr_vector);
  yr_vector_00.v = extraout_RDX_00;
  yr_vector_00._0_8_ = piVar10;
  freeiv((swipe *)(ulong)uVar5,yr_vector_00);
  yr_vector_01.v = extraout_RDX_01;
  yr_vector_01._0_8_ = ones.v;
  freeiv((swipe *)(ulong)uVar9,yr_vector_01);
  yr_vector_02.v = extraout_RDX_02;
  yr_vector_02._0_8_ = pdVar12;
  freev((swipe *)(ulong)uVar6,yr_vector_02);
  yr_vector_03.v = extraout_RDX_03;
  yr_vector_03._0_8_ = pdVar13;
  freev((swipe *)(ulong)uVar7,yr_vector_03);
  pc.v = pdVar11;
  pc._0_8_ = extraout_RDX_04;
  vVar20 = pitch(mVar21,pc,st);
  yr_vector_04.v = vVar20.v;
  vVar22.x = vVar20.x;
  yr_vector_04._0_8_ = pdVar11;
  freev((swipe *)(ulong)xSz,yr_vector_04);
  mVar21.m = extraout_RDX_05;
  mVar21._0_8_ = local_138;
  freem(local_118,mVar21);
  vVar22._4_4_ = 0;
  vVar22.v = yr_vector_04.v;
  return vVar22;
}

Assistant:

vector swipe(const std::vector<double>& waveform, double samplerate, double min,
             double max, double st, double dt) {
#endif
    int i; 
    double td = 0.;
#if 0
    SF_INFO info;
    SNDFILE* source = sf_open_fd(fid, SFM_READ, &info, true);
    if (source == NULL || info.sections < 1) 
        return(makev(0)); 
    double nyquist = info.samplerate / 2.;
    double nyquist2 = info.samplerate;
    double nyquist16 = info.samplerate * 8.;
#else
    double nyquist = samplerate / 2.;
    double nyquist2 = samplerate;
    double nyquist16 = samplerate * 8.;
#endif
    if (max > nyquist) {
        max = nyquist;
        fprintf(stderr, "Max pitch exceeds Nyquist frequency...");
        fprintf(stderr, "max pitch set to %.2f Hz.\n", max);
    }
    if (dt > nyquist2) {
        dt = nyquist2;
        fprintf(stderr, "Timestep > SR...timestep set to %f.\n", nyquist2);
    }
    intvector ws = makeiv(round(log2((nyquist16) / min) -  
                                log2((nyquist16) / max)) + 1); 
    for (i = 0; i < ws.x; i++)
        ws.v[i] = pow(2, round(log2(nyquist16 / min))) / pow(2, i);
    vector pc = makev(ceil((log2(max) - log2(min)) / DLOG2P));
    vector d = makev(pc.x);
    for (i = pc.x - 1; i >= 0; i--) { 
        td = log2(min) + (i * DLOG2P);
        pc.v[i] = pow(2, td);
        d.v[i] = 1. + td - log2(nyquist16 / ws.v[0]); 
    } // td now equals log2(min)
#if 0
    vector x = makev((int) info.frames); // read in the signal
    sf_read_double(source, x.v, x.x);
    sf_close(source); // takes wavf with it, too
#else
    double n = 1. / 32768.;
    int frames = static_cast<int>(waveform.size());
    vector x = makev(frames);
    for (i = 0; i < frames; i++)
        x.v[i] = waveform[i] * n;
#endif
    vector fERBs = makev(ceil((hz2erb(nyquist) - 
                               hz2erb(pow(2, td) / 4)) / DERBS));
    td = hz2erb(min / 4.);
    for (i = 0; i < fERBs.x; i++) 
        fERBs.v[i] = erb2hz(td + (i * DERBS));
    intvector ps = onesiv(floor(fERBs.v[fERBs.x - 1] / pc.v[0] - .75));
    sieve(ps);
    ps.v[0] = PR; // hack to make 1 "act" prime...don't ask
    matrix S = zerom(pc.x, ceil(((double) x.x / nyquist2) / dt));
    Sfirst(S, x, pc, fERBs, d, ws, ps, nyquist, nyquist2, dt, 0); 
    for (i = 1; i < ws.x - 1; i++) // S is updated inline here
        Snth(S, x, pc, fERBs, d, ws, ps, nyquist, nyquist2, dt, i);
    // i is now (ws.x - 1)
    Slast(S, x, pc, fERBs, d, ws, ps, nyquist, nyquist2, dt, i);
    freev(fERBs); 
    freeiv(ws);
    freeiv(ps);
    freev(d);  
    freev(x);
    vector p = pitch(S, pc, st); // find pitch using strength matrix
    freev(pc);
    freem(S);
    return(p);
}